

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O2

bool __thiscall iDynTree::AttitudeMahonyFilter::propagateStates(AttitudeMahonyFilter *this)

{
  AttitudeEstimatorState *q1;
  Vector3 omega;
  RealScalar RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> q;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> Omega;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> gyroUpdate;
  Vector3 gyro_update_dyn;
  UnitQuaternion correction;
  Vector3 *local_178;
  undefined2 in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe92;
  AttitudeEstimatorState *pAVar5;
  double in_stack_fffffffffffffea0;
  Vector3 *local_140 [2];
  undefined1 local_130 [16];
  double local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [24];
  UnitQuaternion local_f0;
  undefined1 local_d0 [24];
  GyroscopeMeasurements *local_b8;
  Vector3 *local_a8;
  scalar_constant_op<double> local_a0;
  Vector3 *local_90;
  scalar_constant_op<double> local_88;
  scalar_constant_op<double> local_78;
  scalar_constant_op<double> local_58;
  scalar_constant_op<double> local_40;
  
  q1 = &this->m_state_mahony;
  local_140[0] = &(this->m_state_mahony).m_angular_velocity;
  local_178 = &(this->m_state_mahony).m_gyroscope_bias;
  local_118[0] = local_108;
  local_58.m_other = (this->m_params_mahony).time_step_in_seconds;
  local_78.m_other = (this->m_params_mahony).kp;
  local_a0.m_other._0_2_ = in_stack_fffffffffffffe90;
  local_40.m_other = 0.5;
  pAVar5 = q1;
  local_b8 = &this->m_Omega_y;
  local_a8 = local_178;
  local_90 = &this->m_omega_mes;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_118,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_d0);
  omega.m_data[0]._2_2_ = SUB62(in_stack_fffffffffffffe92,0);
  omega.m_data[0]._4_4_ = SUB64(in_stack_fffffffffffffe92,2);
  omega.m_data[0]._0_2_ = in_stack_fffffffffffffe90;
  omega.m_data[1] = (double)pAVar5;
  omega.m_data[2] = in_stack_fffffffffffffea0;
  expQuaternion(omega);
  composeQuaternion2((UnitQuaternion *)local_d0,&q1->m_orientation,&local_f0);
  local_130._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        *)local_d0;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>const,0,Eigen::Stride<0,0>>>
            ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)
             &stack0xfffffffffffffe98,
             (Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_130);
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          norm((MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&stack0xfffffffffffffe98);
  dVar2 = ABS(RVar1);
  dVar3 = dVar2 * 2.220446049250313e-16 * 4.0;
  if (dVar2 <= dVar3) {
    iDynTree::reportError
              ("AttitudeMahonyFilter","propagateStates","invalid quaternion with zero norm");
  }
  else {
    RVar1 = Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
            norm((MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&stack0xfffffffffffffe98);
    dVar4 = 1.0;
    if (1.0 <= ABS(RVar1)) {
      dVar4 = ABS(RVar1);
    }
    if (dVar4 * 2.220446049250313e-16 * 4.0 < ABS(RVar1 + -1.0)) {
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::normalize((MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)&stack0xfffffffffffffe98);
    }
    local_d0._16_8_ = local_178;
    local_b8 = (GyroscopeMeasurements *)CONCAT62(local_b8._2_6_,in_stack_fffffffffffffe90);
    local_d0._0_8_ = &this->m_Omega_y;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_140,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_d0);
    local_88.m_other = (this->m_params_mahony).time_step_in_seconds;
    local_a0.m_other = (this->m_params_mahony).ki;
    local_d0._0_8_ = local_178;
    local_b8 = &this->m_omega_mes;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_178,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)local_d0);
    iDynTree::Rotation::RotationFromQuaternion((Rotation *)local_d0,(VectorFixSize *)q1);
    iDynTree::Rotation::operator=(&this->m_orientationInSO3,(Rotation *)local_d0);
    iDynTree::Rotation::RotationFromQuaternion((Rotation *)local_d0,(VectorFixSize *)q1);
    iDynTree::Rotation::asRPY();
    (this->m_orientationInRPY).m_data[2] = local_120;
    (this->m_orientationInRPY).m_data[0] = (double)local_130._0_8_;
    (this->m_orientationInRPY).m_data[1] = (double)local_130._8_8_;
  }
  return dVar3 < dVar2;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::propagateStates()
{
    using iDynTree::toEigen;
    iDynTree::Vector3 gyro_update_dyn;
    auto q(toEigen(m_state_mahony.m_orientation));
    auto Omega(toEigen(m_state_mahony.m_angular_velocity));
    auto b(toEigen(m_state_mahony.m_gyroscope_bias));
    auto gyroUpdate(toEigen(gyro_update_dyn));
    auto Omega_y(toEigen(m_Omega_y));
    auto omega_mes(toEigen(m_omega_mes));

    // compute the correction from the measurements
    gyroUpdate = (Omega_y - b + (omega_mes*m_params_mahony.kp))*m_params_mahony.time_step_in_seconds*0.5;
    iDynTree::UnitQuaternion correction = expQuaternion(gyro_update_dyn);

    // system dynamics equations
    q = toEigen(composeQuaternion2(m_state_mahony.m_orientation, correction));

    int precision{4};
    double malformed_unit_quaternion_norm{0.0};
    if (check_are_almost_equal(q.norm(), malformed_unit_quaternion_norm, precision))
    {
        reportError("AttitudeMahonyFilter", "propagateStates", "invalid quaternion with zero norm");
        return false;
    }

    double unit_quaternion_norm{1.0};
    if (!check_are_almost_equal(q.norm(), unit_quaternion_norm, precision))
    {
        q.normalize();
    }
    Omega = Omega_y - b;
    b = b - (omega_mes*m_params_mahony.ki)*(m_params_mahony.time_step_in_seconds);

    m_orientationInSO3 = iDynTree::Rotation::RotationFromQuaternion(m_state_mahony.m_orientation);
    m_orientationInRPY = iDynTree::Rotation::RotationFromQuaternion(m_state_mahony.m_orientation).asRPY();

    return true;
}